

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

DatatypeValidator * __thiscall
xercesc_4_0::TraverseSchema::getDatatypeValidator
          (TraverseSchema *this,XMLCh *uriStr,XMLCh *localPartStr)

{
  bool bVar1;
  int iVar2;
  SchemaGrammar *this_00;
  DatatypeValidatorFactory *pDVar3;
  XMLCh *pXVar4;
  Grammar *grammar;
  DatatypeValidator *dv;
  XMLCh *localPartStr_local;
  XMLCh *uriStr_local;
  TraverseSchema *this_local;
  
  grammar = (Grammar *)0x0;
  bVar1 = XMLString::equals(uriStr,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  if (bVar1) {
    grammar = (Grammar *)
              DatatypeValidatorFactory::getDatatypeValidator(this->fDatatypeRegistry,localPartStr);
  }
  else {
    XMLBuffer::set(&this->fBuffer,uriStr);
    XMLBuffer::append(&this->fBuffer,L',');
    XMLBuffer::append(&this->fBuffer,localPartStr);
    if ((uriStr == (XMLCh *)0x0) ||
       (bVar1 = XMLString::equals(uriStr,this->fTargetNSURIString), bVar1)) {
      pDVar3 = this->fDatatypeRegistry;
      pXVar4 = XMLBuffer::getRawBuffer(&this->fBuffer);
      grammar = (Grammar *)DatatypeValidatorFactory::getDatatypeValidator(pDVar3,pXVar4);
    }
    else {
      this_00 = (SchemaGrammar *)GrammarResolver::getGrammar(this->fGrammarResolver,uriStr);
      if ((this_00 != (SchemaGrammar *)0x0) &&
         (iVar2 = (*(this_00->super_Grammar).super_XSerializable._vptr_XSerializable[5])(),
         iVar2 == 1)) {
        pDVar3 = SchemaGrammar::getDatatypeRegistry(this_00);
        pXVar4 = XMLBuffer::getRawBuffer(&this->fBuffer);
        grammar = (Grammar *)DatatypeValidatorFactory::getDatatypeValidator(pDVar3,pXVar4);
      }
    }
  }
  return (DatatypeValidator *)grammar;
}

Assistant:

DatatypeValidator*
TraverseSchema::getDatatypeValidator(const XMLCh* const uriStr,
                                     const XMLCh* const localPartStr) {

    DatatypeValidator* dv = 0;

    if (XMLString::equals(uriStr, SchemaSymbols::fgURI_SCHEMAFORSCHEMA)) {
        dv = fDatatypeRegistry->getDatatypeValidator(localPartStr);
    }
    else {

        fBuffer.set(uriStr);
        fBuffer.append(chComma);
        fBuffer.append(localPartStr);

        if ((uriStr) && !XMLString::equals(uriStr, fTargetNSURIString)) {

            Grammar* grammar = fGrammarResolver->getGrammar(uriStr);

            if (grammar && grammar->getGrammarType() == Grammar::SchemaGrammarType) {
                dv = ((SchemaGrammar*) grammar)->getDatatypeRegistry()->getDatatypeValidator(fBuffer.getRawBuffer());
            }
        }
        else {
            dv = fDatatypeRegistry->getDatatypeValidator(fBuffer.getRawBuffer());
        }
    }

    return dv;
}